

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O1

QPDFObjectHandle __thiscall
QPDFPageObjectHelper::getAttribute(QPDFPageObjectHelper *this,string *name,bool copy_if_shared)

{
  function<QPDFObjectHandle_()> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  QPDFObjectHandle QVar2;
  undefined8 local_28;
  undefined8 uStack_20;
  code *local_18;
  undefined8 uStack_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_18 = (code *)0x0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  QVar2 = getAttribute(this,name,copy_if_shared,in_RCX,SUB81(&local_28,0));
  _Var1._M_pi = QVar2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
    _Var1._M_pi = extraout_RDX;
  }
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageObjectHelper::getAttribute(std::string const& name, bool copy_if_shared)
{
    return getAttribute(name, copy_if_shared, nullptr, false);
}